

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O1

void __thiscall
xray_re::xr_level_ai::vertex_position
          (xr_level_ai *this,uint32_t *packed_xz,uint16_t *packed_y,fvector3 *position)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = (position->field_0).field_0.z;
  fVar1 = this->m_size;
  fVar2 = (this->m_aabb).field_0.field_1.z1;
  fVar4 = floorf(((position->field_0).field_0.x - (this->m_aabb).field_0.field_1.x1) / fVar1 + 0.5);
  uVar3 = this->m_row_length;
  fVar5 = floorf((fVar5 - fVar2) / fVar1 + 0.5);
  *packed_xz = (int)(long)fVar5 + (int)(long)fVar4 * uVar3;
  fVar5 = floorf((((position->field_0).field_0.y - (this->m_aabb).field_0.field_1.y1) /
                 this->m_size_y) * 65535.0 + 1e-07);
  *packed_y = (uint16_t)(int)fVar5;
  return;
}

Assistant:

void xr_level_ai::vertex_position(uint32_t& packed_xz, uint16_t& packed_y, const fvector3& position) const
{
	float x = (position.x - m_aabb.min.x)/m_size + 0.5f;
	float z = (position.z - m_aabb.min.z)/m_size + 0.5f;
	packed_xz = uint32_t(std::floor(x))*m_row_length + uint32_t(std::floor(z));
	packed_y = uint16_t(std::floor((position.y - m_aabb.min.y)/m_size_y*65535.f + 1e-7f));
}